

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  FieldGenerator *pFVar10;
  pointer ppFVar11;
  LogMessage *pLVar12;
  LogMessage *other;
  undefined8 *puVar13;
  uint uVar14;
  pointer ppFVar15;
  uint extraout_EDX;
  int __c;
  int extraout_EDX_00;
  ulong uVar16;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  undefined8 extraout_RDX_00;
  AlphaNum *a;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int new_index;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  FieldDescriptor *__s;
  protobuf *this_00;
  long lVar22;
  int j;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  Hex hex;
  Printer *pPStack_c0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  LogMessage local_98;
  FieldGeneratorMap *local_60;
  string mask;
  
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n// @@protoc_insertion_point(generalized_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "const $classname$* source =\n    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n        &from);\nif (source == NULL) {\n// @@protoc_insertion_point(generalized_merge_from_cast_fail:$full_name$)\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n// @@protoc_insertion_point(generalized_merge_from_cast_success:$full_name$)\n  MergeFrom(*source);\n}\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",&this->classname_);
  }
  io::Printer::Print(printer,
                     "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  pcVar21 = 
  "_internal_metadata_.MergeFrom(from._internal_metadata_);\n::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
  ;
  io::Printer::Print(printer,
                     "_internal_metadata_.MergeFrom(from._internal_metadata_);\n::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
                    );
  local_60 = &this->field_generators_;
  local_a8 = 0xffffffff;
  local_a4 = local_a8;
  uVar23 = 0;
  do {
    do {
      uVar8 = uVar23;
      uVar24 = (ulong)(int)uVar8;
      if ((ulong)((long)(this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar24) {
        for (lVar25 = 0; lVar25 < *(int *)(this->descriptor_ + 0x38); lVar25 = lVar25 + 1) {
          lVar22 = lVar25 * 0x30;
          io::Printer::Print(printer,"switch (from.$oneofname$_case()) {\n","oneofname",
                             *(string **)(*(long *)(this->descriptor_ + 0x40) + lVar22));
          io::Printer::Indent(printer);
          for (lVar26 = 0; puVar13 = (undefined8 *)(*(long *)(this->descriptor_ + 0x40) + lVar22),
              lVar26 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar22);
              lVar26 = lVar26 + 1) {
            pFVar1 = *(FieldDescriptor **)(puVar13[4] + lVar26 * 8);
            UnderscoresToCamelCase((string *)&local_98,*(string **)pFVar1,true);
            io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            io::Printer::Indent(printer);
            pFVar10 = FieldGeneratorMap::get(local_60,pFVar1);
            (*pFVar10->_vptr_FieldGenerator[0xb])(pFVar10,printer);
            io::Printer::Print(printer,"break;\n");
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
          }
          ToUpper((string *)&local_98,(string *)*puVar13);
          io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                             "cap_oneof_name",(string *)&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        if (this->num_weak_fields_ != 0) {
          io::Printer::Print(printer,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
        return;
      }
      if (uVar8 == local_a4) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xbde);
        pcVar21 = (char *)internal::LogMessage::operator<<
                                    (&local_98,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&mask,(LogMessage *)pcVar21);
        internal::LogMessage::~LogMessage(&local_98);
      }
      while( true ) {
        ppFVar11 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar15 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar16 = (long)ppFVar15 - (long)ppFVar11 >> 3;
        pPStack_c0 = (Printer *)pcVar21;
        if ((uVar16 <= uVar24) ||
           (pPStack_c0 = (Printer *)ppFVar11[uVar24], *(int *)&pPStack_c0->field_0x4c != 3)) break;
        pFVar10 = FieldGeneratorMap::get(local_60,(FieldDescriptor *)pPStack_c0);
        pcVar21 = &printer->variable_delimiter_;
        (*pFVar10->_vptr_FieldGenerator[0xb])(pFVar10);
        uVar24 = uVar24 + 1;
      }
      this_00 = (protobuf *)0x0;
      local_ac = 0xffffffff;
      uVar19 = 0xffffffffffffffff;
      uVar27 = 0xffffffff;
      while( true ) {
        uVar23 = (uint)uVar24;
        iVar18 = (int)uVar19;
        uVar9 = (uint)this_00;
        local_a4 = uVar8;
        if (((ulong)((long)ppFVar15 - (long)ppFVar11 >> 3) <= uVar24) ||
           (*(int *)(ppFVar11[uVar24] + 0x4c) == 3)) break;
        uVar14 = 0;
        if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
          pcVar21 = FieldDescriptor::index
                              (ppFVar11[uVar24],&pPStack_c0->variable_delimiter_,(int)uVar16);
          uVar14 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)pcVar21];
        }
        pPStack_c0 = (Printer *)0x8;
        uVar2 = (long)(int)uVar14 / 8;
        uVar16 = (long)(int)uVar14 % 8 & 0xffffffff;
        uVar20 = uVar2 & 0xffffffff;
        uVar3 = uVar23;
        if ((iVar18 != -1) &&
           (uVar20 = uVar19, pcVar21 = &((Printer *)0x8)->variable_delimiter_, uVar3 = local_ac,
           (int)uVar2 != iVar18)) goto LAB_0027e753;
        local_ac = uVar3;
        this_00 = (protobuf *)(ulong)(uVar9 | 1 << (uVar14 & 0x1f));
        uVar24 = uVar24 + 1;
        ppFVar11 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar15 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar19 = uVar20;
        uVar27 = uVar23;
      }
      pcVar21 = &pPStack_c0->variable_delimiter_;
    } while (iVar18 == -1);
LAB_0027e753:
    if (local_ac == 0xffffffff) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xc0b);
      pcVar21 = (char *)internal::LogMessage::operator<<
                                  (&local_98,"CHECK failed: (-1) != (last_chunk_start): ");
      internal::LogFinisher::operator=((LogFinisher *)&mask,(LogMessage *)pcVar21);
      internal::LogMessage::~LogMessage(&local_98);
    }
    if (uVar27 == 0xffffffff) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xc0c);
      pcVar21 = (char *)internal::LogMessage::operator<<
                                  (&local_98,"CHECK failed: (-1) != (last_chunk_end): ");
      internal::LogFinisher::operator=((LogFinisher *)&mask,(LogMessage *)pcVar21);
      internal::LogMessage::~LogMessage(&local_98);
    }
    if (uVar9 == 0) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xc0d);
      pcVar21 = (char *)internal::LogMessage::operator<<
                                  (&local_98,"CHECK failed: (0) != (last_chunk_mask): ");
      internal::LogFinisher::operator=((LogFinisher *)&mask,(LogMessage *)pcVar21);
      internal::LogMessage::~LogMessage(&local_98);
    }
    uVar8 = popcnt(uVar9);
    bVar28 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
    bVar29 = local_ac != uVar27;
    uVar17 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar29 && bVar28);
    if (bVar29 && bVar28) {
      if ((int)uVar8 < 2) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xc17);
        pLVar12 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (2) <= (count): ");
        internal::LogFinisher::operator=((LogFinisher *)&mask,pLVar12);
LAB_0027e8d7:
        internal::LogMessage::~LogMessage(&local_98);
      }
      else if (8 < uVar8) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xc18);
        pLVar12 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (8) >= (count): ");
        internal::LogFinisher::operator=((LogFinisher *)&mask,pLVar12);
        goto LAB_0027e8d7;
      }
      uVar24 = (ulong)(uint)(iVar18 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
      uVar16 = (long)uVar24 / 4;
      uVar8 = (uint)((long)uVar24 % 4);
      uVar9 = (uint)uVar16;
      if (local_a8 != uVar9) {
        SimpleItoa_abi_cxx11_((string *)&local_98,(protobuf *)(uVar16 & 0xffffffff),uVar8);
        io::Printer::Print(printer,"cached_has_bits = from._has_bits_[$new_index$];\n","new_index",
                           (string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        uVar8 = extraout_EDX;
        local_a8 = uVar9;
      }
      SimpleItoa_abi_cxx11_((string *)&local_98,this_00,uVar8);
      pcVar21 = "if (cached_has_bits & $mask$u) {\n";
      io::Printer::Print(printer,"if (cached_has_bits & $mask$u) {\n","mask",(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      io::Printer::Indent(printer);
      uVar17 = extraout_RDX_00;
    }
    lVar25 = (long)(int)local_ac;
    bVar5 = false;
    while( true ) {
      iVar18 = (int)uVar17;
      pLVar12 = &local_98;
      if ((int)uVar27 < lVar25) break;
      pFVar1 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar25];
      __s = pFVar1;
      pFVar10 = FieldGeneratorMap::get(local_60,pFVar1);
      if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pLVar12,"from.",(allocator<char> *)&mask);
        bVar6 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)pLVar12,pFVar1);
        std::__cxx11::string::~string((string *)pLVar12);
      }
      else {
        pcVar21 = FieldDescriptor::index(pFVar1,(char *)__s,__c);
        iVar18 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)pcVar21];
        if ((*(char *)(*(long *)(pFVar1 + 0x80) + 0x6f) == '\0') && (local_a8 == iVar18 / 0x20)) {
          hex.value = 1L << ((byte)iVar18 & 0x1f);
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)pLVar12,hex);
          StrCat_abi_cxx11_(&mask,(protobuf *)pLVar12,a);
          io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",&mask);
          pLVar12 = (LogMessage *)&mask;
        }
        else {
          FieldName_abi_cxx11_
                    ((string *)pLVar12,(cpp *)pFVar1,
                     (FieldDescriptor *)((long)iVar18 % 0x20 & 0xffffffff));
          io::Printer::Print(printer,"if (from.has_$name$()) {\n","name",(string *)pLVar12);
        }
        std::__cxx11::string::~string((string *)pLVar12);
        io::Printer::Indent(printer);
        bVar6 = true;
      }
      if (bVar29 && bVar28) {
        bVar7 = anon_unknown_0::IsPOD(pFVar1);
        lVar22 = 0x60;
        bVar4 = true;
        if (!bVar7) goto LAB_0027eaa2;
      }
      else {
LAB_0027eaa2:
        lVar22 = 0x58;
        bVar4 = bVar5;
      }
      bVar5 = bVar4;
      pcVar21 = &printer->variable_delimiter_;
      (**(code **)((long)pFVar10->_vptr_FieldGenerator + lVar22))(pFVar10);
      uVar17 = extraout_RDX_01;
      if (bVar6 != false) {
        io::Printer::Outdent(printer);
        pcVar21 = "}\n";
        io::Printer::Print(printer,"}\n");
        uVar17 = extraout_RDX_02;
      }
      lVar25 = lVar25 + 1;
    }
    if (bVar29 && bVar28) {
      if (bVar5) {
        if ((int)local_a8 < 0) {
          internal::LogMessage::LogMessage
                    (pLVar12,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc5d);
          other = internal::LogMessage::operator<<
                            (pLVar12,"CHECK failed: (0) <= (cached_has_bit_index): ");
          internal::LogFinisher::operator=((LogFinisher *)&mask,other);
          internal::LogMessage::~LogMessage(pLVar12);
          iVar18 = extraout_EDX_00;
        }
        SimpleItoa_abi_cxx11_((string *)pLVar12,(protobuf *)(ulong)local_a8,iVar18);
        io::Printer::Print(printer,"_has_bits_[$index$] |= cached_has_bits;\n","index",
                           (string *)pLVar12);
        std::__cxx11::string::~string((string *)pLVar12);
      }
      io::Printer::Outdent(printer);
      pcVar21 = "}\n";
      io::Printer::Print(printer,"}\n");
    }
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
        "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
        "// @@protoc_insertion_point(generalized_merge_from_start:"
        "$full_name$)\n"
        "  GOOGLE_DCHECK_NE(&from, this);\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n"
      "        &from);\n"
      "if (source == NULL) {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_fail:"
      "$full_name$)\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_success:"
      "$full_name$)\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_, "full_name", descriptor_->full_name());

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  GOOGLE_DCHECK_NE(&from, this);\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  printer->Print(
    "_internal_metadata_.MergeFrom(from._internal_metadata_);\n"
    "::google::protobuf::uint32 cached_has_bits = 0;\n"
    "(void) cached_has_bits;\n\n");

  // cached_has_bit_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_bit_index]
  // for cached_has_bit_index >= 0
  int cached_has_bit_index = -1;

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Merge Repeated fields. These fields do not require a
    // check as we can simply iterate over them.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateMergingCode(printer);
    }

    // Merge Optional and Required fields (after a _has_bit_ check).
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        if (cached_has_bit_index != last_chunk / 4) {
          int new_index = last_chunk / 4;
          printer->Print("cached_has_bits = from._has_bits_[$new_index$];\n",
                         "new_index", SimpleItoa(new_index));
          cached_has_bit_index = new_index;
        }

        printer->Print(
          "if (cached_has_bits & $mask$u) {\n",
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit clears for each of the fields we processed.
      bool deferred_has_bit_changes = false;
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          // Attempt to use the state of cached_has_bits, if possible.
          int has_bit_index = has_bit_indices_[field->index()];
          if (!field->options().weak() &&
              cached_has_bit_index == has_bit_index / 32) {
            const string mask = StrCat(
                strings::Hex(1u << (has_bit_index % 32),
                strings::ZERO_PAD_8));

            printer->Print(
                "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
          } else {
            printer->Print(
              "if (from.has_$name$()) {\n",
              "name", FieldName(field));
          }

          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "from.", field);
        }

        if (have_outer_if && IsPOD(field)) {
          // GenerateCopyConstructorCode for enum and primitive scalar fields
          // does not do _has_bits_ modifications.  We defer _has_bits_
          // manipulation until the end of the outer if.
          //
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        if (deferred_has_bit_changes) {
          // Flush the has bits for the primitives we deferred.
          GOOGLE_CHECK_LE(0, cached_has_bit_index);
          printer->Print(
              "_has_bits_[$index$] |= cached_has_bits;\n",
              "index", SimpleItoa(cached_has_bit_index));
        }

        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }
  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}